

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.cpp
# Opt level: O3

bool __thiscall
slang::ast::Expression::bindMembershipExpressions
          (Expression *this,ASTContext *context,TokenKind keyword,bool requireIntegral,
          bool unwrapUnpacked,bool allowTypeReferences,bool allowOpenRange,
          ExpressionSyntax *valueExpr,
          span<const_slang::syntax::ExpressionSyntax_*const,_18446744073709551615UL> expressions,
          SmallVectorBase<const_slang::ast::Expression_*> *results)

{
  SourceLocation compilation;
  long lVar1;
  SyntaxNode *pSVar2;
  Expression *pEVar3;
  bool bVar4;
  SourceLocation this_00;
  Type *pTVar5;
  Type *pTVar6;
  Diagnostic *pDVar7;
  undefined7 in_register_00000009;
  char *func;
  undefined6 in_register_00000012;
  ulong uVar8;
  undefined7 in_register_00000081;
  undefined3 in_register_00000089;
  long lVar9;
  bitmask<slang::ast::ASTFlags> extraFlags;
  string_view sVar10;
  undefined7 in_stack_00000009;
  anon_class_48_6_7cdd41da checkType;
  bool local_8c;
  bool local_8b;
  TokenKind local_8a;
  Expression *local_88;
  Type *local_80;
  undefined4 local_74;
  undefined4 local_70;
  undefined4 local_6c;
  ASTContext *local_68;
  anon_class_48_6_7cdd41da local_60;
  
  local_6c = CONCAT31(in_register_00000089,allowTypeReferences);
  local_70 = (undefined4)CONCAT71(in_register_00000009,requireIntegral);
  local_74 = (undefined4)CONCAT62(in_register_00000012,keyword);
  local_8a = (TokenKind)context;
  if (*(SourceLocation **)this == (SourceLocation *)0x0) {
    func = 
    "T slang::not_null<const slang::ast::Scope *>::get() const [T = const slang::ast::Scope *]";
LAB_003c0711:
    assert::assertFailed
              ("ptr",
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
               ,0x26,func);
  }
  extraFlags.m_bits._0_4_ = (int)CONCAT71(in_register_00000081,unwrapUnpacked) << 0x11;
  extraFlags.m_bits._4_4_ = 0;
  compilation = **(SourceLocation **)this;
  this_00 = (SourceLocation)
            create((Compilation *)compilation,
                   (ExpressionSyntax *)CONCAT71(in_stack_00000009,allowOpenRange),(ASTContext *)this
                   ,extraFlags,(Type *)0x0);
  local_60.type = (Type **)this_00;
  SmallVectorBase<slang::ast::Expression_const*>::emplace_back<slang::ast::Expression_const*>
            ((SmallVectorBase<slang::ast::Expression_const*> *)expressions.size_,
             (Expression **)&local_60);
  pTVar5 = ((not_null<const_slang::ast::Type_*> *)((long)this_00 + 8))->ptr;
  if (pTVar5 == (Type *)0x0) {
LAB_003c06fc:
    func = "T slang::not_null<const slang::ast::Type *>::get() const [T = const slang::ast::Type *]"
    ;
    goto LAB_003c0711;
  }
  local_80 = pTVar5;
  local_8c = bad((Expression *)this_00);
  local_8b = isImplicitString((Expression *)this_00);
  if ((char)local_74 == '\0') {
    bVar4 = Type::isAggregate(local_80);
    if (!bVar4) goto LAB_003c0405;
  }
  else {
    bVar4 = Type::isIntegral(local_80);
    if (bVar4) goto LAB_003c0405;
  }
  if (local_8c == false) {
    pDVar7 = ASTContext::addDiag((ASTContext *)this,(DiagCode)0x260007,
                                 *(SourceRange *)((long)this_00 + 0x20));
    pDVar7 = ast::operator<<(pDVar7,local_80);
    sVar10 = parsing::LexerFacts::getTokenKindText(local_8a);
    Diagnostic::operator<<(pDVar7,sVar10);
    local_8c = true;
  }
LAB_003c0405:
  local_60.type = &local_80;
  local_60.canBeStrings = &local_8b;
  local_60.keyword = &local_8a;
  local_60.bad = &local_8c;
  local_60.comp = (Compilation *)compilation;
  local_60.context = (ASTContext *)this;
  if (expressions.data_ != (pointer)0x0) {
    pSVar2 = &valueExpr->super_SyntaxNode;
    local_68 = (ASTContext *)this;
    do {
      local_88 = create((Compilation *)compilation,*(ExpressionSyntax **)valueExpr,
                        (ASTContext *)this,extraFlags,(Type *)0x0);
      SmallVectorBase<slang::ast::Expression_const*>::
      emplace_back<slang::ast::Expression_const*const&>
                ((SmallVectorBase<slang::ast::Expression_const*> *)expressions.size_,&local_88);
      bVar4 = bad(local_88);
      local_8c = (bool)(bVar4 | local_8c);
      if (local_8c == false) {
        if (((char)local_6c == '\0') || (local_88->kind != OpenRange)) {
          pTVar5 = (local_88->type).ptr;
          if (pTVar5 == (Type *)0x0) goto LAB_003c06fc;
          if ((char)local_74 == '\0') {
            if ((char)local_70 != '\0') {
              while (bVar4 = Type::isUnpackedArray(pTVar5), bVar4) {
                pTVar5 = Type::getArrayElementType(pTVar5);
              }
            }
            if ((local_8b == true) && (bVar4 = isImplicitString(local_88), !bVar4)) {
              pTVar6 = pTVar5->canonical;
              if (pTVar6 == (Type *)0x0) {
                Type::resolveCanonical(pTVar5);
                pTVar6 = pTVar5->canonical;
              }
              if ((pTVar6->super_Symbol).kind != StringType) {
                local_8b = false;
              }
            }
            bindMembershipExpressions::anon_class_48_6_7cdd41da::operator()
                      (&local_60,local_88,pTVar5);
          }
          else {
            bVar4 = Type::isIntegral(pTVar5);
            if (bVar4) {
              local_80 = binaryOperatorType((Compilation *)compilation,local_80,pTVar5,false,false);
            }
            else {
              pDVar7 = ASTContext::addDiag((ASTContext *)this,(DiagCode)0x260007,
                                           local_88->sourceRange);
              pDVar7 = ast::operator<<(pDVar7,pTVar5);
              sVar10 = parsing::LexerFacts::getTokenKindText(local_8a);
              Diagnostic::operator<<(pDVar7,sVar10);
              local_8c = true;
            }
          }
        }
        else {
          if ((local_8b == true) && (bVar4 = isImplicitString(local_88), !bVar4)) {
            local_8b = false;
          }
          pEVar3 = local_88;
          if (local_88->kind != OpenRange) {
            assert::assertFailed
                      ("T::isKind(kind)",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/ast/Expression.h"
                       ,0x125,
                       "T &slang::ast::Expression::as() [T = slang::ast::OpenRangeExpression]");
          }
          pTVar5 = ((*(Expression **)(local_88 + 1))->type).ptr;
          if (pTVar5 == (Type *)0x0) goto LAB_003c06fc;
          bindMembershipExpressions::anon_class_48_6_7cdd41da::operator()
                    (&local_60,*(Expression **)(local_88 + 1),pTVar5);
          pTVar5 = pEVar3[1].type.ptr;
          pTVar6 = (Type *)(pTVar5->super_Symbol).name._M_len;
          if (pTVar6 == (Type *)0x0) goto LAB_003c06fc;
          bindMembershipExpressions::anon_class_48_6_7cdd41da::operator()
                    (&local_60,(Expression *)pTVar5,pTVar6);
          this = (Expression *)local_68;
        }
      }
      valueExpr = (ExpressionSyntax *)((long)valueExpr + 8);
    } while (valueExpr != (ExpressionSyntax *)(&pSVar2->parent + (long)expressions.data_));
  }
  if (local_8c == false) {
    bVar4 = true;
    if (*(long *)(expressions.size_ + 8) != 0) {
      lVar1 = *(long *)expressions.size_;
      lVar9 = *(long *)(expressions.size_ + 8) << 3;
      uVar8 = 0;
      do {
        local_88 = *(Expression **)(lVar1 + uVar8 * 8);
        bVar4 = Type::isNumeric(local_80);
        pTVar5 = local_80;
        if (bVar4) {
LAB_003c067c:
          pTVar5 = (local_88->type).ptr;
          if (pTVar5 == (Type *)0x0) goto LAB_003c06fc;
          bVar4 = Type::isUnpackedArray(pTVar5);
          if (bVar4) goto LAB_003c0693;
          contextDetermined((ASTContext *)this,&local_88,local_80,(SourceLocation)0x0);
        }
        else {
          pTVar6 = local_80->canonical;
          if (pTVar6 == (Type *)0x0) {
            Type::resolveCanonical(local_80);
            pTVar6 = pTVar5->canonical;
          }
          if ((pTVar6->super_Symbol).kind == StringType) goto LAB_003c067c;
LAB_003c0693:
          selfDetermined((ASTContext *)this,&local_88);
        }
        bVar4 = bad(local_88);
        if (bVar4) goto LAB_003c061e;
        if (*(ulong *)(expressions.size_ + 8) <= uVar8) {
          assert::assertFailed
                    ("index < len",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/SmallVector.h"
                     ,0x196,
                     "reference slang::SmallVectorBase<const slang::ast::Expression *>::operator[](size_type) [T = const slang::ast::Expression *]"
                    );
        }
        *(Expression **)(*(long *)expressions.size_ + uVar8 * 8) = local_88;
        uVar8 = uVar8 + 1;
        lVar9 = lVar9 + -8;
      } while (lVar9 != 0);
      bVar4 = true;
    }
  }
  else {
LAB_003c061e:
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool Expression::bindMembershipExpressions(const ASTContext& context, TokenKind keyword,
                                           bool requireIntegral, bool unwrapUnpacked,
                                           bool allowTypeReferences, bool allowOpenRange,
                                           const ExpressionSyntax& valueExpr,
                                           span<const ExpressionSyntax* const> expressions,
                                           SmallVectorBase<const Expression*>& results) {
    auto extraFlags = allowTypeReferences ? ASTFlags::AllowTypeReferences : ASTFlags::None;
    Compilation& comp = context.getCompilation();
    Expression& valueRes = create(comp, valueExpr, context, extraFlags);
    results.push_back(&valueRes);

    const Type* type = valueRes.type;
    bool bad = valueRes.bad();
    bool canBeStrings = valueRes.isImplicitString();

    if ((!requireIntegral && type->isAggregate()) || (requireIntegral && !type->isIntegral())) {
        if (!bad) {
            context.addDiag(diag::BadSetMembershipType, valueRes.sourceRange)
                << *type << LexerFacts::getTokenKindText(keyword);
            bad = true;
        }
    }

    auto checkType = [&](const Expression& expr, const Type& bt) {
        if (bt.isNumeric() && type->isNumeric()) {
            type = binaryOperatorType(comp, type, &bt, false);
        }
        else if ((bt.isClass() && bt.isAssignmentCompatible(*type)) ||
                 (type->isClass() && type->isAssignmentCompatible(bt))) {
            // ok
        }
        else if ((bt.isCHandle() || bt.isNull()) && (type->isCHandle() || type->isNull())) {
            // ok
        }
        else if ((bt.isEvent() || bt.isNull()) && (type->isEvent() || type->isNull())) {
            // ok
        }
        else if ((bt.isCovergroup() || bt.isNull()) && (type->isCovergroup() || type->isNull())) {
            // ok
        }
        else if (bt.isTypeRefType() && type->isTypeRefType()) {
            // ok
        }
        else if (canBeStrings) {
            // If canBeStrings is still true, it means either this specific type or
            // the common type (or both) are of type string. This is ok, but force
            // all further expressions to also be strings (or implicitly
            // convertible to them).
            type = &comp.getStringType();
        }
        else if (bt.isAggregate()) {
            // Aggregates are just never allowed in membership expressions.
            context.addDiag(diag::BadSetMembershipType, expr.sourceRange)
                << bt << LexerFacts::getTokenKindText(keyword);
            bad = true;
        }
        else {
            // Couldn't find a common type.
            context.addDiag(diag::NoCommonComparisonType, expr.sourceRange)
                << LexerFacts::getTokenKindText(keyword) << bt << *type;
            bad = true;
        }
    };

    // We need to find a common type across all expressions. If this is for a wildcard
    // case statement, the types can only be integral. Otherwise all singular types are allowed.
    for (auto expr : expressions) {
        Expression* bound = &create(comp, *expr, context, extraFlags);
        results.push_back(bound);
        bad |= bound->bad();
        if (bad)
            continue;

        // Special handling for open range expressions -- they don't have
        // a real type on their own, we need to check their bounds.
        if (allowOpenRange && bound->kind == ExpressionKind::OpenRange) {
            if (canBeStrings && !bound->isImplicitString())
                canBeStrings = false;

            auto& range = bound->as<OpenRangeExpression>();
            checkType(range.left(), *range.left().type);
            checkType(range.right(), *range.right().type);
            continue;
        }

        const Type* bt = bound->type;
        if (requireIntegral) {
            if (!bt->isIntegral()) {
                context.addDiag(diag::BadSetMembershipType, bound->sourceRange)
                    << *bt << LexerFacts::getTokenKindText(keyword);
                bad = true;
            }
            else {
                type = binaryOperatorType(comp, type, bt, false);
            }
            continue;
        }

        // If this is an "inside" operation, then unpacked arrays are unwrapped
        // into their element types before checking further.
        if (unwrapUnpacked) {
            while (bt->isUnpackedArray())
                bt = bt->getArrayElementType();
        }

        if (canBeStrings && !bound->isImplicitString() && !bt->isString())
            canBeStrings = false;

        checkType(*bound, *bt);
    }

    if (bad)
        return false;

    size_t index = 0;
    for (auto result : results) {
        // const_casts here are because we want the result array to be constant and
        // don't want to waste time / space allocating another array here locally just
        // to immediately copy it to the output.
        Expression* expr = const_cast<Expression*>(result);

        if ((type->isNumeric() || type->isString()) && !expr->type->isUnpackedArray())
            contextDetermined(context, expr, *type);
        else
            selfDetermined(context, expr);

        if (expr->bad())
            return false;

        results[index++] = expr;
    }

    return true;
}